

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hmmd.cpp
# Opt level: O1

void image_match::rgb2hmmd_pixel_inplace(pixel p)

{
  byte bVar1;
  byte bVar2;
  byte *pbVar3;
  ulong uVar4;
  byte *pbVar5;
  int iVar6;
  byte *pbVar7;
  byte bVar8;
  byte bVar9;
  
  pbVar5 = p.first_;
  uVar4 = (long)p.last_ - (long)pbVar5;
  if ((p.last_ != pbVar5) && (1 < uVar4)) {
    bVar2 = *pbVar5;
    pbVar7 = pbVar5 + 1;
    bVar1 = pbVar5[1];
    pbVar3 = pbVar7;
    bVar8 = bVar1;
    if (bVar2 < bVar1) {
      pbVar3 = pbVar5;
      bVar8 = bVar2;
    }
    if (uVar4 != 2) {
      if (pbVar5[2] <= bVar8) {
        pbVar3 = pbVar5 + 2;
      }
      bVar8 = *pbVar3;
      bVar9 = bVar1;
      if (bVar1 < bVar2) {
        pbVar7 = pbVar5;
        bVar9 = bVar2;
      }
      if (uVar4 != 2) {
        pbVar3 = pbVar5 + 2;
        if (pbVar5[2] < bVar9) {
          pbVar3 = pbVar7;
        }
        bVar9 = *pbVar3;
        iVar6 = (uint)bVar9 - (uint)bVar8;
        if ((byte)iVar6 == 0) {
          bVar2 = 0;
        }
        else if (bVar9 == bVar2) {
          if (uVar4 == 2) goto LAB_0016e2df;
          bVar2 = (byte)((int)(((uint)bVar1 - (uint)pbVar5[2]) * 0x2b) / iVar6);
        }
        else if (bVar9 == bVar1) {
          if (uVar4 == 2) goto LAB_0016e2df;
          bVar2 = (char)((int)(((uint)pbVar5[2] - (uint)bVar2) * 0x2b) / iVar6) + 0x55;
        }
        else {
          bVar2 = (char)((int)(((uint)bVar2 - (uint)bVar1) * 0x2b) / iVar6) + 0xab;
        }
        *pbVar5 = bVar2;
        pbVar5[1] = (byte)((uint)bVar9 + (uint)bVar8 >> 1);
        if (uVar4 != 2) {
          pbVar5[2] = (byte)iVar6;
          return;
        }
      }
    }
  }
LAB_0016e2df:
  gsl::detail::fail_fast_terminate();
}

Assistant:

void
rgb2hmmd_pixel_inplace(pixel p)
{
    pixel::value_type min, max;

    min =
      p[0] < p[1] ? (p[0] < p[2] ? p[0] : p[2]) : (p[1] < p[2] ? p[1] : p[2]);
    max =
      p[0] > p[1] ? (p[0] > p[2] ? p[0] : p[2]) : (p[1] > p[2] ? p[1] : p[2]);

    pixel::value_type sum, diff, hue;
    diff = max - min;
    sum = static_cast<pixel::value_type>(
      (static_cast<int>(max) + static_cast<int>(min)) >> 1);
    hue = 0;

    // Hue is defined same as in HSV
    if (diff) {
        if (max == p[0])
            hue = 43 * (p[1] - p[2]) / (max - min);
        else if (max == p[1])
            hue = 85 + 43 * (p[2] - p[0]) / (max - min);
        else
            hue = 171 + 43 * (p[0] - p[1]) / (max - min);
    }

    p[0] = hue;
    p[1] = sum;
    p[2] = diff;
}